

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ParseContext::ParseGroup
          (ParseContext *this,MessageLite *msg,char *ptr,uint32_t tag)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  LogMessage local_78;
  Voidify local_61;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_41;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int local_30;
  int old_group_depth;
  int old_depth;
  uint32_t tag_local;
  char *ptr_local;
  MessageLite *msg_local;
  ParseContext *this_local;
  
  iVar2 = this->depth_ + -1;
  this->depth_ = iVar2;
  if (iVar2 < 0) {
    this_local = (ParseContext *)0x0;
  }
  else {
    this->group_depth_ = this->group_depth_ + 1;
    local_30 = this->depth_;
    absl_log_internal_check_op_result._4_4_ = this->group_depth_;
    old_group_depth = tag;
    _old_depth = (ParseContext *)ptr;
    ptr_local = (char *)msg;
    msg_local = (MessageLite *)this;
    _old_depth = (ParseContext *)MessageLite::_InternalParse(msg,ptr,this);
    if (_old_depth != (ParseContext *)0x0) {
      iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(local_30);
      iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(this->depth_);
      local_40 = absl::lts_20250127::log_internal::Check_EQImpl(iVar2,iVar3,"old_depth == depth_");
      if (local_40 != (Nullable<const_char_*>)0x0) {
        pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_40);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x24c,pcVar4);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&absl_log_internal_check_op_result_1);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
      }
      iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result._4_4_);
      iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(this->group_depth_);
      local_60 = absl::lts_20250127::log_internal::Check_EQImpl
                           (iVar2,iVar3,"old_group_depth == group_depth_");
      if (local_60 != (Nullable<const_char_*>)0x0) {
        pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_60);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x24d,pcVar4);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_78);
      }
      local_60 = (Nullable<const_char_*>)0x0;
    }
    this->group_depth_ = this->group_depth_ + -1;
    this->depth_ = this->depth_ + 1;
    bVar1 = EpsCopyInputStream::ConsumeEndGroup(&this->super_EpsCopyInputStream,old_group_depth);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local = _old_depth;
    }
    else {
      this_local = (ParseContext *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

[[nodiscard]] PROTOBUF_NDEBUG_INLINE const char* ParseGroup(MessageLite* msg,
                                                              const char* ptr,
                                                              uint32_t tag) {
    if (--depth_ < 0) return nullptr;
    group_depth_++;
    auto old_depth = depth_;
    auto old_group_depth = group_depth_;
    ptr = msg->_InternalParse(ptr, this);
    if (ptr != nullptr) {
      ABSL_DCHECK_EQ(old_depth, depth_);
      ABSL_DCHECK_EQ(old_group_depth, group_depth_);
    }
    group_depth_--;
    depth_++;
    if (ABSL_PREDICT_FALSE(!ConsumeEndGroup(tag))) return nullptr;
    return ptr;
  }